

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.hpp
# Opt level: O1

OpenMDBitSet * __thiscall OpenMD::OpenMDBitSet::operator-=(OpenMDBitSet *this,OpenMDBitSet *bs)

{
  OpenMDBitSet tmp;
  OpenMDBitSet local_38;
  
  operator^(&local_38,this,bs);
  andOperator(this,&local_38);
  if (local_38.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_38.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_38.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_38.bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return this;
}

Assistant:

OpenMDBitSet& operator-=(const OpenMDBitSet& bs) {
      OpenMDBitSet tmp = *this ^ bs;
      *this &= tmp;
      return *this;
    }